

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdscpp::reset(gdscpp *this)

{
  gdscpp *this_local;
  
  this->version_number = 7;
  this->generations = 3;
  this->units[0] = 0.001;
  this->units[1] = 1e-09;
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::clear(&this->STR);
  std::vector<int,_std::allocator<int>_>::clear(&this->last_modified);
  std::__cxx11::string::operator=((string *)&this->library_name,"Untitled_library");
  return;
}

Assistant:

void gdscpp::reset()
{
  version_number = 7;
  generations = 3;
  units[0] = 0.001;
  units[1] = 1e-9;
  STR.clear();
  last_modified.clear();
  library_name = "Untitled_library";
}